

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O0

void print_valtype(wasm_valtype_t *type)

{
  char cVar1;
  wasm_valtype_t *type_local;
  
  cVar1 = wasm_valtype_kind(type);
  if (cVar1 == '\0') {
    printf("i32");
  }
  else if (cVar1 == '\x01') {
    printf("i64");
  }
  else if (cVar1 == '\x02') {
    printf("f32");
  }
  else if (cVar1 == '\x03') {
    printf("f64");
  }
  else if (cVar1 == -0x80) {
    printf("anyref");
  }
  else if (cVar1 == -0x7f) {
    printf("funcref");
  }
  return;
}

Assistant:

void print_valtype(const wasm_valtype_t* type) {
  switch (wasm_valtype_kind(type)) {
    case WASM_I32: printf("i32"); break;
    case WASM_I64: printf("i64"); break;
    case WASM_F32: printf("f32"); break;
    case WASM_F64: printf("f64"); break;
    case WASM_ANYREF: printf("anyref"); break;
    case WASM_FUNCREF: printf("funcref"); break;
  }
}